

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::interval_t,duckdb::dtime_tz_t,duckdb::dtime_tz_t,duckdb::BinaryStandardOperatorWrapper,duckdb::AddTimeOperator,bool,false,false>
               (interval_t *ldata,dtime_tz_t *rdata,dtime_tz_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  unsigned_long *puVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  dtime_tz_t dVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  int64_t *piVar15;
  ulong uVar16;
  interval_t right;
  interval_t right_00;
  interval_t right_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar15 = &ldata->micros;
    for (iVar13 = 0; count != iVar13; iVar13 = iVar13 + 1) {
      uVar3 = ((interval_t *)(piVar15 + -1))->months;
      uVar8 = ((interval_t *)(piVar15 + -1))->days;
      right_01.days = uVar8;
      right_01.months = uVar3;
      right_01.micros = *piVar15;
      dVar9 = AddTimeOperator::Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                        (rdata[iVar13].bits,right_01);
      result_data[iVar13].bits = dVar9.bits;
      piVar15 = piVar15 + 2;
    }
  }
  else {
    uVar14 = 0;
    for (uVar11 = 0; uVar11 != count + 0x3f >> 6; uVar11 = uVar11 + 1) {
      puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
LAB_007cb787:
        piVar15 = &ldata[uVar14].micros;
        for (; uVar10 = uVar14, uVar14 < uVar12; uVar14 = uVar14 + 1) {
          uVar1 = ((interval_t *)(piVar15 + -1))->months;
          uVar6 = ((interval_t *)(piVar15 + -1))->days;
          right.days = uVar6;
          right.months = uVar1;
          right.micros = *piVar15;
          dVar9 = AddTimeOperator::
                  Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                            (rdata[uVar14].bits,right);
          result_data[uVar14].bits = dVar9.bits;
          piVar15 = piVar15 + 2;
        }
      }
      else {
        uVar5 = puVar4[uVar11];
        uVar12 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar12 = count;
        }
        if (uVar5 == 0xffffffffffffffff) goto LAB_007cb787;
        uVar10 = uVar12;
        if (uVar5 != 0) {
          piVar15 = &ldata[uVar14].micros;
          for (uVar16 = 0; uVar10 = uVar16 + uVar14, uVar16 + uVar14 < uVar12; uVar16 = uVar16 + 1)
          {
            if ((uVar5 >> (uVar16 & 0x3f) & 1) != 0) {
              uVar2 = ((interval_t *)(piVar15 + -1))->months;
              uVar7 = ((interval_t *)(piVar15 + -1))->days;
              right_00.days = uVar7;
              right_00.months = uVar2;
              right_00.micros = *piVar15;
              dVar9 = AddTimeOperator::
                      Operation<duckdb::dtime_tz_t,duckdb::interval_t,duckdb::dtime_tz_t>
                                (rdata[uVar14 + uVar16].bits,right_00);
              result_data[uVar14 + uVar16].bits = dVar9.bits;
            }
            piVar15 = piVar15 + 2;
          }
        }
      }
      uVar14 = uVar10;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}